

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kph.cpp
# Opt level: O0

void __thiscall
HA_Candlestick::HA_Candlestick(HA_Candlestick *this,Candlestick *curr,HA_Candlestick *prior)

{
  double *pdVar1;
  HA_Candlestick *prior_local;
  Candlestick *curr_local;
  HA_Candlestick *this_local;
  
  (this->super_Candlestick).time = curr->time;
  (this->super_Candlestick).volume = curr->volume;
  (this->super_Candlestick).close = (curr->open + curr->close + curr->low + curr->high) / 4.0;
  (this->super_Candlestick).open =
       ((prior->super_Candlestick).open + (prior->super_Candlestick).close) / 2.0;
  pdVar1 = std::min<double>((double *)this,&(this->super_Candlestick).close);
  pdVar1 = std::min<double>(&curr->low,pdVar1);
  (this->super_Candlestick).low = *pdVar1;
  pdVar1 = std::max<double>((double *)this,&(this->super_Candlestick).close);
  pdVar1 = std::max<double>(&curr->high,pdVar1);
  (this->super_Candlestick).high = *pdVar1;
  return;
}

Assistant:

HA_Candlestick(const Candlestick& curr, const HA_Candlestick& prior) 
   {
      time = curr.time;
      volume = curr.volume;
      close =  (curr.open + curr.close + curr.low + curr.high) / 4;
      open = (prior.open + prior.close) / 2;
      low = min(curr.low, min(open, close)); 
      high = max(curr.high, max(open, close));
   }